

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
               (CodedInputStream *input,RepeatedField<unsigned_long> *values)

{
  bool bVar1;
  int iVar2;
  uint64 local_30;
  unsigned_long value;
  Limit limit;
  int length;
  RepeatedField<unsigned_long> *values_local;
  CodedInputStream *input_local;
  
  _limit = values;
  values_local = (RepeatedField<unsigned_long> *)input;
  bVar1 = io::CodedInputStream::ReadVarintSizeAsInt(input,(int *)((long)&value + 4));
  if (bVar1) {
    value._0_4_ = io::CodedInputStream::PushLimit((CodedInputStream *)values_local,value._4_4_);
    while (iVar2 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)values_local),
          0 < iVar2) {
      bVar1 = ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                        ((CodedInputStream *)values_local,&local_30);
      if (!bVar1) {
        return false;
      }
      RepeatedField<unsigned_long>::Add(_limit,&local_30);
    }
    io::CodedInputStream::PopLimit((CodedInputStream *)values_local,(Limit)value);
    input_local._7_1_ = true;
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

inline bool WireFormatLite::ReadPackedPrimitive(io::CodedInputStream* input,
                                                RepeatedField<CType>* values) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    CType value;
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->Add(value);
  }
  input->PopLimit(limit);
  return true;
}